

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O0

void __thiscall
PFData_test_unflattenIndex_Test::PFData_test_unflattenIndex_Test
          (PFData_test_unflattenIndex_Test *this)

{
  PFData_test *in_RDI;
  
  PFData_test::PFData_test(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__PFData_test_unflattenIndex_Test_001ae088;
  return;
}

Assistant:

TEST_F(PFData_test, unflattenIndex){
    PFData test("tests/inputs/press.init.pfb");
    test.loadHeader();
    test.loadData();

    //Small function to reflatten index for easy checking
    auto flatten = [&](const std::array<int, 3>& zyx){
        return  zyx[0]*test.getNX()*test.getNY() + zyx[1]*test.getNX() + zyx[2];
    };

    const int maxIdx = test.getNZ() * test.getNY() * test.getNX() - 1;

    {
        const int expected = maxIdx;
        const int calculated = flatten(test.unflattenIndex(expected));
        EXPECT_EQ(expected, calculated);
    }
    {
        const int expected = maxIdx/2;
        const int calculated = flatten(test.unflattenIndex(expected));
        EXPECT_EQ(expected, calculated);
    }
    {
        const int expected = maxIdx/3;
        const int calculated = flatten(test.unflattenIndex(expected));
        EXPECT_EQ(expected, calculated);
    }
    {
        const int expected = maxIdx/4;
        const int calculated = flatten(test.unflattenIndex(expected));
        EXPECT_EQ(expected, calculated);
    }
    {
        const int expected = maxIdx/5;
        const int calculated = flatten(test.unflattenIndex(expected));
        EXPECT_EQ(expected, calculated);
    }

    const std::array<int, 3> invalid = {-1, -1, -1};
    EXPECT_EQ(invalid, test.unflattenIndex(maxIdx+2));
    EXPECT_EQ(invalid, test.unflattenIndex(maxIdx+1));
    EXPECT_EQ(invalid, test.unflattenIndex(-1));

    test.close();
}